

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_expect_str_match(mpack_reader_t *reader,char *str,size_t len)

{
  byte bVar1;
  mpack_error_t mVar2;
  size_t local_20;
  size_t len_local;
  char *str_local;
  mpack_reader_t *reader_local;
  
  if (0xffffffff < len) {
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  mpack_expect_str_length(reader,(uint32_t)len);
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    mpack_reader_track_bytes(reader,len);
    len_local = (size_t)str;
    for (local_20 = len; local_20 != 0; local_20 = local_20 - 1) {
      bVar1 = mpack_expect_native_u8(reader);
      if ((uint)bVar1 != (int)*(char *)len_local) {
        mpack_reader_flag_error(reader,mpack_error_type);
        return;
      }
      len_local = len_local + 1;
    }
    mpack_done_str(reader);
  }
  return;
}

Assistant:

void mpack_expect_str_match(mpack_reader_t* reader, const char* str, size_t len) {
    mpack_assert(str != NULL, "str cannot be NULL");

    // expect a str the correct length
    if (len > UINT32_MAX)
        mpack_reader_flag_error(reader, mpack_error_type);
    mpack_expect_str_length(reader, (uint32_t)len);
    if (mpack_reader_error(reader))
        return;
    mpack_reader_track_bytes(reader, len);

    // check each byte one by one (matched strings are likely to be very small)
    for (; len > 0; --len) {
        if (mpack_expect_native_u8(reader) != *str++) {
            mpack_reader_flag_error(reader, mpack_error_type);
            return;
        }
    }

    mpack_done_str(reader);
}